

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcarray.c
# Opt level: O0

LispPTR find_symbol(char *char_base,DLword offset,DLword length,LispPTR hashtbl,DLword fatp,
                   DLword lispp)

{
  LispPTR LVar1;
  LispPTR LAddr;
  LispPTR array;
  LispPTR LVar2;
  uint uVar3;
  LispPTR *pLVar4;
  DLword *pDVar5;
  ushort uVar6;
  LispPTR local_9c;
  LispPTR *local_98;
  uint *local_90;
  char *pname_base;
  PNCell *pnptr;
  LispPTR index;
  int fatpnamep;
  arrayheader *vec68k;
  LispPTR hash;
  LispPTR vec;
  LispPTR hashes;
  LispPTR vecs;
  hashtable *hashtbladdr;
  ushort local_2e;
  int arraylen;
  DLword indexvar;
  DLword ehash;
  DLword h2;
  DLword ehashval;
  DLword hashval;
  DLword lispp_local;
  DLword fatp_local;
  LispPTR hashtbl_local;
  DLword length_local;
  DLword offset_local;
  char *char_base_local;
  
  uVar3 = (uint)offset;
  if (hashtbl != 0) {
    if (lispp == 0) {
      indexvar = compute_hash(char_base,offset,length);
    }
    else {
      indexvar = compute_lisp_hash(char_base,offset,length,fatp);
    }
    pLVar4 = NativeAligned4FromLAddr(hashtbl);
    if (fatp != 0) {
      uVar3 = uVar3 << 1;
    }
    _hashtbl_local = char_base + (int)uVar3;
    vec = *pLVar4;
    hash = pLVar4[1];
    do {
      LAddr = car(vec);
      vec = cdr(vec);
      array = car(hash);
      hash = cdr(hash);
      pLVar4 = NativeAligned4FromLAddr(LAddr);
      LVar1 = pLVar4[2];
      if (LVar1 == 0) {
        return 0xffffffff;
      }
      uVar6 = (short)((long)(ulong)indexvar % (long)(int)(LVar1 - 2)) + 1;
      local_2e = (ushort)((long)(ulong)indexvar % (long)(int)LVar1);
      while( true ) {
        while( true ) {
          LVar2 = aref1(array,(uint)local_2e);
          if ((uint)(ushort)((short)(((uint)(length ^ indexvar) ^ (int)(uint)indexvar >> 8) % 0xfe)
                            + 2) != (LVar2 & 0xff)) break;
          pnptr._0_4_ = aref1(LAddr,(uint)local_2e);
          if (((LispPTR)pnptr & 0xfff0000) == 0xe0000) {
            pnptr._0_4_ = (LispPTR)pnptr & 0xffff;
          }
          if (((LispPTR)pnptr & 0xfff0000) == 0) {
            local_90 = (uint *)(AtomSpace + (ulong)((LispPTR)pnptr * 5) * 2);
          }
          else {
            local_90 = NativeAligned4FromLAddr((LispPTR)pnptr);
          }
          if (((LispPTR)pnptr & 0xfff0000) == 0) {
            local_98 = (LispPTR *)(AtomSpace + (ulong)((LispPTR)pnptr * 5) * 2);
          }
          else {
            local_98 = NativeAligned4FromLAddr((LispPTR)pnptr);
          }
          local_98 = local_98 + 3;
          uVar3 = (uint)((ulong)*(undefined8 *)local_98 >> 0x2d) & 1;
          pDVar5 = NativeAligned2FromLAddr(*local_90 & 0xfffffff);
          if (length == *(byte *)((ulong)pDVar5 ^ 3)) {
            if (lispp == 0) {
              local_9c = compare_chars((char *)((long)pDVar5 + (long)(int)uVar3 + 1),_hashtbl_local,
                                       length);
            }
            else {
              local_9c = compare_lisp_chars((char *)((long)pDVar5 + (long)(int)uVar3 + 1),
                                            _hashtbl_local,length,(DLword)uVar3,fatp);
            }
            if (local_9c == 1) {
              return (LispPTR)pnptr;
            }
          }
          local_2e = (ushort)((long)(ulong)((uint)local_2e + (uint)uVar6) % (long)(int)LVar1);
        }
        if ((short)(LVar2 & 0xff) == 0) break;
        local_2e = (ushort)((long)(ulong)((uint)local_2e + (uint)uVar6) % (long)(int)LVar1);
      }
    } while (hash != 0);
  }
  return 0xffffffff;
}

Assistant:

LispPTR find_symbol(const char *char_base, DLword offset, DLword length, LispPTR hashtbl, DLword fatp,
                    DLword lispp)

/* T => the "chars" coming in are 16-bit */
/* T => the incoming chars are in LISP space */
{
  DLword hashval, ehashval, h2, ehash, indexvar;
  int arraylen;
  struct hashtable *hashtbladdr;
#ifdef BIGATOMS
  LispPTR vecs, hashes;
#endif /* BIGATOMS */

  LispPTR vec, hash;
  struct arrayheader *vec68k;
  int fatpnamep;

  if (!hashtbl) return (0xffffffff);

  if (lispp)
    hashval = compute_lisp_hash(char_base, offset, length, fatp);
  else
    hashval = compute_hash(char_base, offset, length);

  ehashval = Entry_hash(length, hashval);
  hashtbladdr = (struct hashtable *)NativeAligned4FromLAddr(hashtbl);

  /* Move our string ptr up by offset, allowing for fatness */
  if (fatp)
    char_base += (offset << 1);
  else
    char_base += offset;

#ifdef BIGATOMS
  vecs = hashtbladdr->table;
  hashes = hashtbladdr->hash;

loop_thru_hashtables:

  vec = car(vecs);
  vecs = cdr(vecs);
  hash = car(hashes);
  hashes = cdr(hashes);
  vec68k = (struct arrayheader *)NativeAligned4FromLAddr(vec);
  arraylen = vec68k->totalsize;
  if (arraylen == 0) return (0xffffffff); /*kludge TAKE*/
  h2 = Rehash_factor(hashval, arraylen);
  indexvar = (hashval % arraylen);
#else
  vec = hashtbladdr->table;
  hash = hashtbladdr->hash;
  vec68k = (struct arrayheader *)NativeAligned4FromLAddr(vec);
  arraylen = vec68k->totalsize;
  if (arraylen == 0) return (0xffffffff); /*kludge TAKE*/
  h2 = Rehash_factor(hashval, arraylen);
  indexvar = (hashval % arraylen);
#endif /* BIGATOMS */

retry:
  /* the aref1 returns a smallp, which is always <256, so trim it */
  while (ehashval != (ehash = 0xFF & aref1(hash, indexvar))) {
    if (ehash == NIL) { /* Ran out of entries in this table; try next or fail */
#ifdef BIGATOMS
      if (hashes == NIL) return (0xffffffff); /* Last table.  Fail. */
      goto loop_thru_hashtables;
#else
      return (0xffffffff);
#endif /* BIGATOMS */
    }
    indexvar = Symbol_hash_reprobe(indexvar, h2, arraylen);
  }
  /*   if ((indexvar&0xffff) != NIL) */
  {
    LispPTR index;
    PNCell *pnptr;
    char *pname_base;

    index = aref1(vec, indexvar);
    if ((index & SEGMASK) == S_POSITIVE) index &= 0xFFFF;

    pnptr = (PNCell *)GetPnameCell(index);
    fatpnamep = ((PLCell *)GetPropCell(index))->fatpnamep;
    pname_base = (char *)NativeAligned2FromLAddr(pnptr->pnamebase);
    if ((length == GETBYTE(pname_base)) &&
        (T == ((lispp) ? compare_lisp_chars((pname_base + 1 + fatpnamep), char_base, length,
                                            fatpnamep, fatp)
                       : compare_chars((pname_base + 1 + fatpnamep), char_base, length)))) {
      return (index);
    } else {
      indexvar = Symbol_hash_reprobe(indexvar, h2, arraylen);
      goto retry;
    }
  }
  /*   else return(0xffffffff); */ /* can't find */
}